

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::anon_unknown_5::MthdSyfmSrcPos::adjust_orig_mthd(MthdSyfmSrcPos *this)

{
  mt19937 *this_00;
  byte *pbVar1;
  uint32_t *puVar2;
  result_type rVar3;
  
  this_00 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .rnd;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  if ((rVar3 & 1) == 0) {
    puVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.xy_misc_4;
    *(byte *)puVar2 = (byte)*puVar2 | 0xf0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.ctx_user =
         ((this->super_SingleMthdTest).super_MthdTest.subc & 7) << 0xd |
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.ctx_user & 0xffff1fff;
  }
  else {
    pbVar1 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                             cliprect_ctrl + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  if ((rVar3 & 1) != 0) {
    puVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid;
    *puVar2 = *puVar2 | 0x100033;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar3 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid
                       + 1);
      *pbVar1 = *pbVar1 | 0xf;
    }
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar3 & 1) != 0) {
      puVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid;
      *puVar2 = *puVar2 | 0x3f000;
    }
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    puVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.valid;
    *puVar2 = *puVar2 ^ 1 << ((byte)rVar3 & 0x1f);
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		// XXX: disable this some day and test the actual DMA
		switch (rnd() % 2) {
			case 0:
				insrt(orig.xy_misc_4[0], 4, 4, 0xf);
				insrt(orig.ctx_user, 13, 3, subc);
				break;
			case 1:
				insrt(orig.cliprect_ctrl, 8, 1, 1);
				break;
		}
		if (rnd() & 1) {
			orig.valid[0] |= 0x100033;
			if (rnd() & 1)
				orig.valid[0] |= 0x000f00;
			if (rnd() & 1)
				orig.valid[0] |= 0x03f000;
			orig.valid[0] ^= 1 << (rnd() & 0x1f);
		}
	}